

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

ctmbstr textFromOneNode(TidyDocImpl *doc,Node *node)

{
  tmbchar *ptVar1;
  long lVar2;
  uint uVar3;
  Lexer *pLVar4;
  ulong uVar5;
  
  ptVar1 = (doc->access).text;
  if ((node == (Node *)0x0) || (uVar3 = node->start, node->end <= uVar3)) {
    uVar5 = 0;
  }
  else {
    pLVar4 = doc->lexer;
    uVar5 = 0;
    do {
      ptVar1[uVar5] = pLVar4->lexbuf[uVar5 + uVar3];
      if (uVar5 == 0x7f) {
        uVar5 = 0x7f;
        break;
      }
      lVar2 = uVar3 + uVar5;
      uVar5 = uVar5 + 1;
    } while (lVar2 + 1U < (ulong)node->end);
    uVar5 = uVar5 & 0xffffffff;
  }
  ptVar1[uVar5] = '\0';
  return ptVar1;
}

Assistant:

static ctmbstr textFromOneNode( TidyDocImpl* doc, Node* node )
{
    uint i;
    uint x = 0;
    tmbstr txt = doc->access.text;
    
    if ( node )
    {
        /* Copy contents of a text node */
        for (i = node->start; i < node->end; ++i, ++x )
        {
            txt[x] = doc->lexer->lexbuf[i];

            /* Check buffer overflow */
            if ( x >= sizeof(doc->access.text)-1 )
                break;
        }
    }

    txt[x] = '\0';
    return txt;
}